

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlChar * xmlNodeGetLang(xmlNode *cur)

{
  xmlChar *pxVar1;
  
  if (cur == (xmlNode *)0x0) {
    return (xmlChar *)0x0;
  }
  if (cur->type != XML_NAMESPACE_DECL) {
    do {
      pxVar1 = xmlGetNsProp(cur,"lang",(xmlChar *)"http://www.w3.org/XML/1998/namespace");
      if (pxVar1 != (xmlChar *)0x0) {
        return pxVar1;
      }
      cur = cur->parent;
    } while (cur != (_xmlNode *)0x0);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlNodeGetLang(const xmlNode *cur) {
    xmlChar *lang;

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL))
        return(NULL);
    while (cur != NULL) {
        lang = xmlGetNsProp(cur, BAD_CAST "lang", XML_XML_NAMESPACE);
	if (lang != NULL)
	    return(lang);
	cur = cur->parent;
    }
    return(NULL);
}